

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nghttp2_http.c
# Opt level: O1

ssize_t sf_parse_token(nghttp2_sf_value *dest,uint8_t *begin,uint8_t *end)

{
  uint8_t uVar1;
  ssize_t sVar2;
  byte *pbVar3;
  byte *pbVar4;
  uint8_t *p;
  
  uVar1 = *begin;
  if ((0xe5 < (byte)(uVar1 + 0xa5)) || (sVar2 = -1, uVar1 == '*' || (byte)(uVar1 + 0x9f) < 0x1a)) {
    pbVar4 = begin;
    pbVar3 = begin;
    if (begin != end) {
      do {
        pbVar4 = pbVar3;
        if (SF_TOKEN_CHARS[*pbVar4] == 0) break;
        pbVar3 = pbVar4 + 1;
        pbVar4 = end;
      } while (pbVar3 != end);
    }
    if (dest != (nghttp2_sf_value *)0x0) {
      dest->type = '\x04';
      (dest->field_1).s.base = begin;
      (dest->field_1).s.len = (long)pbVar4 - (long)begin;
    }
    sVar2 = (long)pbVar4 - (long)begin;
  }
  return sVar2;
}

Assistant:

static ssize_t sf_parse_token(nghttp2_sf_value *dest, const uint8_t *begin,
                              const uint8_t *end) {
  const uint8_t *p = begin;

  if ((*p < 'A' || 'Z' < *p) && (*p < 'a' || 'z' < *p) && *p != '*') {
    return -1;
  }

  for (; p != end && SF_TOKEN_CHARS[*p]; ++p)
    ;

  if (dest) {
    dest->type = NGHTTP2_SF_VALUE_TYPE_TOKEN;
    dest->s.base = begin;
    dest->s.len = (size_t)(p - begin);
  }

  return p - begin;
}